

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

void __thiscall
spvtools::opt::Loop::GetExitBlocks
          (Loop *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *exit_blocks)

{
  bool bVar1;
  CFG *this_00;
  BasicBlockListTy *this_01;
  reference pvVar2;
  BasicBlock *this_02;
  anon_class_16_2_7879672e local_78;
  function<void_(unsigned_int)> local_68;
  BasicBlock *local_48;
  BasicBlock *bb;
  _Node_iterator_base<unsigned_int,_false> _Stack_38;
  uint32_t bb_id;
  const_iterator __end2;
  const_iterator __begin2;
  BasicBlockListTy *__range2;
  CFG *cfg;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *exit_blocks_local;
  Loop *this_local;
  
  this_00 = IRContext::cfg(this->context_);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear(exit_blocks);
  this_01 = GetBlocks(this);
  __end2 = std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin(this_01);
  _Stack_38._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(this_01);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<unsigned_int,_false>,
                       &stack0xffffffffffffffc8);
    if (!bVar1) break;
    pvVar2 = std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*(&__end2);
    bb._4_4_ = *pvVar2;
    this_02 = CFG::block(this_00,bb._4_4_);
    local_78.exit_blocks = exit_blocks;
    local_78.this = this;
    local_48 = this_02;
    std::function<void(unsigned_int)>::
    function<spvtools::opt::Loop::GetExitBlocks(std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>*)const::__0,void>
              ((function<void(unsigned_int)> *)&local_68,&local_78);
    BasicBlock::ForEachSuccessorLabel(this_02,&local_68);
    std::function<void_(unsigned_int)>::~function(&local_68);
    std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++(&__end2);
  }
  return;
}

Assistant:

void Loop::GetExitBlocks(std::unordered_set<uint32_t>* exit_blocks) const {
  CFG* cfg = context_->cfg();
  exit_blocks->clear();

  for (uint32_t bb_id : GetBlocks()) {
    const BasicBlock* bb = cfg->block(bb_id);
    bb->ForEachSuccessorLabel([exit_blocks, this](uint32_t succ) {
      if (!IsInsideLoop(succ)) {
        exit_blocks->insert(succ);
      }
    });
  }
}